

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
google::protobuf::internal::InternalMetadata::
DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(InternalMetadata *this)

{
  SooRep *this_00;
  int iVar1;
  void *pvVar2;
  
  pvVar2 = (void *)(this->ptr_ & 0xfffffffffffffffe);
  if (pvVar2 != (void *)0x0) {
    this_00 = (SooRep *)((long)pvVar2 + 8);
    iVar1 = SooRep::size(this_00,(*(byte *)((long)pvVar2 + 8) & 4) == 0);
    if (iVar1 != 0) {
      UnknownFieldSet::ClearFallback((UnknownFieldSet *)this_00);
    }
    RepeatedField<google::protobuf::UnknownField>::~RepeatedField
              ((RepeatedField<google::protobuf::UnknownField> *)this_00);
  }
  operator_delete(pvVar2,0x18);
  this->ptr_ = 0;
  return;
}

Assistant:

PROTOBUF_NOINLINE void DeleteOutOfLineHelper() {
    delete PtrValue<Container<T>>();
    // TODO:  This store is load-bearing.  Since we are destructing
    // the message at this point, see if we can eliminate it.
    ptr_ = 0;
  }